

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * __thiscall CScript::operator<<(CScript *this,opcodetype opcode)

{
  uint uVar1;
  uint uVar2;
  CScript *pCVar3;
  runtime_error *this_00;
  long in_FS_OFFSET;
  uchar local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (opcode < 0x100) {
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar3 = this;
    }
    local_19 = (uchar)opcode;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&this->super_CScriptBase,
               (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2),&local_19);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return this;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"CScript::operator<<(): invalid opcode");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CScript& operator<<(opcodetype opcode) LIFETIMEBOUND
    {
        if (opcode < 0 || opcode > 0xff)
            throw std::runtime_error("CScript::operator<<(): invalid opcode");
        insert(end(), (unsigned char)opcode);
        return *this;
    }